

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubroutineUniform::SubroutineUniform
          (SubroutineUniform *this,UniformValueGenerator *generator,
          SubroutineFunctionSet *_functions,Loc _location,int _arraySize,DefOccurence _defOccurence,
          bool _used)

{
  int *__args;
  iterator __position;
  pointer pfVar1;
  pointer pfVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pSVar5;
  pointer pSVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  undefined1 local_1b8 [96];
  _Alloc_hider local_158;
  int local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  pair<int,_int> local_138;
  string local_130 [32];
  string local_110 [32];
  pair<int,_int> local_f0;
  GLenum local_e8;
  bool local_e4;
  bool bStack_e3;
  UniformType local_d8;
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  local_48;
  
  SubroutineFunctionSet::SubroutineFunctionSet(&this->functions,_functions);
  (this->location).super_LayoutSpecifierBase.val = (int)_location.super_LayoutSpecifierBase._0_8_;
  (this->location).super_LayoutSpecifierBase.numSys =
       (int)((ulong)_location.super_LayoutSpecifierBase._0_8_ >> 0x20);
  (this->location).super_LayoutSpecifierBase.occurence.occurence =
       _location.super_LayoutSpecifierBase.occurence.occurence.occurence;
  this->arraySize = _arraySize;
  (this->defOccurence).occurence = _defOccurence.occurence;
  this->used = _used;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType((UniformType *)local_1b8,0x1405,0);
  UniformValue::UniformValue(&this->embeddedUIntUniform,(UniformType *)local_1b8,generator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p,(ulong)(local_148._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_1b8._64_8_ != local_1b8 + 0x50) {
    operator_delete((void *)local_1b8._64_8_,local_1b8._80_8_ + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector((vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
             *)(local_1b8 + 0x28));
  if ((pointer)local_1b8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._8_8_,local_1b8._24_8_ - local_1b8._8_8_);
  }
  __args = &this->arraySize;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  iVar7 = this->arraySize;
  bVar9 = iVar7 != 0;
  if (-1 < iVar7) {
    if (!bVar9) {
      *__args = 1;
      iVar7 = 1;
    }
    this->isArray = bVar9;
    __position._M_current =
         (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->arraySizesSegmented,__position,__args);
    }
    else {
      *__position._M_current = iVar7;
      (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    UniformType::UniformType(&local_d8,0x1405,*__args);
    UniformValue::UniformValue((UniformValue *)local_1b8,&local_d8,generator);
    pfVar1 = (this->embeddedUIntUniform).fValues.super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pfVar2 = (this->embeddedUIntUniform).fValues.super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->embeddedUIntUniform).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1b8._0_8_;
    (this->embeddedUIntUniform).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1b8._8_8_;
    (this->embeddedUIntUniform).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._16_8_;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1b8._16_8_ = (pointer)0x0;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1,(long)pfVar2 - (long)pfVar1);
    }
    piVar3 = (this->embeddedUIntUniform).iValues.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar4 = (this->embeddedUIntUniform).iValues.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->embeddedUIntUniform).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1b8._24_8_;
    (this->embeddedUIntUniform).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1b8._32_8_;
    (this->embeddedUIntUniform).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._40_8_;
    local_1b8._24_8_ = (pointer)0x0;
    local_1b8._32_8_ = (pointer)0x0;
    local_1b8._40_8_ = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    }
    piVar3 = (this->embeddedUIntUniform).uValues.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar4 = (this->embeddedUIntUniform).uValues.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->embeddedUIntUniform).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1b8._48_8_;
    (this->embeddedUIntUniform).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1b8._56_8_;
    (this->embeddedUIntUniform).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._64_8_;
    local_1b8._48_8_ = (pointer)0x0;
    local_1b8._56_8_ = (pointer)0x0;
    local_1b8._64_8_ = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    }
    (this->embeddedUIntUniform).type.enumType = local_1b8._72_4_;
    piVar3 = (this->embeddedUIntUniform).type.arraySizesSegmented.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (this->embeddedUIntUniform).type.arraySizesSegmented.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    (this->embeddedUIntUniform).type.arraySizesSegmented.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_1b8._80_8_;
    (this->embeddedUIntUniform).type.arraySizesSegmented.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_1b8._88_8_;
    (this->embeddedUIntUniform).type.arraySizesSegmented.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
         = (pointer)local_158._M_p;
    local_1b8._80_8_ = 0;
    local_1b8._88_8_ = 0;
    local_158._M_p = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    }
    (this->embeddedUIntUniform).type.arraySize = local_150;
    local_48.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->embeddedUIntUniform).type.childTypes.
         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(pair<int,_int> *)
     &(this->embeddedUIntUniform).type.childTypes.
      super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_138;
    local_48.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->embeddedUIntUniform).type.childTypes.
         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->embeddedUIntUniform).type.childTypes.
         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->embeddedUIntUniform).type.childTypes.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_148._M_allocated_capacity;
    (this->embeddedUIntUniform).type.childTypes.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
    local_148._M_allocated_capacity = 0;
    local_148._8_8_ = 0;
    local_138.first = 0;
    local_138.second = 0;
    std::
    vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ::~vector(&local_48);
    std::__cxx11::string::operator=((string *)&(this->embeddedUIntUniform).type.strType,local_130);
    std::__cxx11::string::operator=
              ((string *)&(this->embeddedUIntUniform).type.refStrType,local_110);
    (this->embeddedUIntUniform).type.size = local_f0;
    (this->embeddedUIntUniform).type.isArray = local_e4;
    (this->embeddedUIntUniform).type.signedType = bStack_e3;
    (this->embeddedUIntUniform).type.baseType = local_e8;
    UniformValue::~UniformValue((UniformValue *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.refStrType._M_dataplus._M_p != &local_d8.refStrType.field_2) {
      operator_delete(local_d8.refStrType._M_dataplus._M_p,
                      local_d8.refStrType.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.strType._M_dataplus._M_p != &local_d8.strType.field_2) {
      operator_delete(local_d8.strType._M_dataplus._M_p,
                      local_d8.strType.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ::~vector(&local_d8.childTypes);
    if (local_d8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.arraySizesSegmented.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.arraySizesSegmented.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (0 < *__args) {
      pSVar5 = (this->functions).fn.
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      piVar3 = (this->embeddedUIntUniform).uValues.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar6 = (this->functions).fn.
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        piVar3[lVar8] =
             (int)((ulong)(long)piVar3[lVar8] %
                  (ulong)(((long)pSVar5 - (long)pSVar6 >> 3) * 0xf83e0f83e0f83e1));
        lVar8 = lVar8 + 1;
      } while (lVar8 < *__args);
    }
    return;
  }
  __assert_fail("arraySize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x32a,
                "glcts::(anonymous namespace)::SubroutineUniform::SubroutineUniform(UniformValueGenerator &, SubroutineFunctionSet &, Loc, int, DefOccurence, bool)"
               );
}

Assistant:

SubroutineUniform(UniformValueGenerator& generator, SubroutineFunctionSet& _functions, Loc _location,
					  int _arraySize = 0, DefOccurence _defOccurence = DefOccurence::ALL_SH, bool _used = true)
		: functions(_functions)
		, location(_location)
		, arraySize(_arraySize)
		, defOccurence(_defOccurence)
		, used(_used)
		, embeddedUIntUniform(GL_UNSIGNED_INT, generator)
	{

		assert(arraySize >= 0);

		if (!arraySize)
		{
			arraySize = 1;
			isArray   = false;
		}
		else
		{
			isArray = true;
		}

		arraySizesSegmented.push_back(arraySize);

		embeddedUIntUniform = UniformValue(UniformType(GL_UNSIGNED_INT, arraySize), generator);
		for (int i = 0; i < arraySize; i++)
		{
			embeddedUIntUniform.uValues[i] = static_cast<GLint>(embeddedUIntUniform.uValues[i] % functions.fn.size());
		}
	}